

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O3

void __thiscall
CNetAddr::UnserializeV2Stream<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>
          (CNetAddr *this,ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *s)

{
  uint uVar1;
  HashVerifier<AutoFile> *pHVar2;
  uint uVar3;
  uint8_t possible_bip155_net;
  bool bVar4;
  uint64_t address_size_00;
  CNetAddr *pCVar5;
  string *psVar6;
  size_t in_RCX;
  long lVar7;
  unsigned_long *in_R8;
  long in_FS_OFFSET;
  size_t address_size;
  uint8_t obj;
  uint64_t local_58;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar2 = s->m_substream;
  AutoFile::read(pHVar2->m_source,(int)&local_50,(void *)0x1,in_RCX);
  CSHA256::Write((CSHA256 *)pHVar2,(uchar *)&local_50,1);
  possible_bip155_net = (uint8_t)local_50._M_dataplus._M_p;
  address_size_00 =
       ReadCompactSize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(s,true);
  local_58 = address_size_00;
  if (0x200 < address_size_00) {
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_long,unsigned_long>
              (&local_50,(tinyformat *)"Address too long: %u > %u",(char *)&local_58,
               &MAX_ADDRV2_SIZE,in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar6);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(psVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_00857f17;
  }
  this->m_scope_id = 0;
  bVar4 = SetNetFromBIP155Network(this,possible_bip155_net,address_size_00);
  if (!bVar4) {
    HashVerifier<AutoFile>::ignore(s->m_substream,address_size_00);
    goto LAB_00857de9;
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,(size_type)address_size_00)
  ;
  uVar1 = (this->m_addr)._size;
  uVar3 = uVar1 - 0x11;
  pCVar5 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
  if (uVar1 < 0x11) {
    uVar3 = uVar1;
    pCVar5 = this;
  }
  pHVar2 = s->m_substream;
  AutoFile::read(pHVar2->m_source,(int)pCVar5,(void *)(ulong)uVar3,in_RCX);
  CSHA256::Write((CSHA256 *)pHVar2,(uchar *)pCVar5,(size_t)(ulong)uVar3);
  if (this->m_net == NET_IPV6) {
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
    }
    if (5 < uVar3) {
      pCVar5 = this;
      if (0x10 < uVar1) {
        pCVar5 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      lVar7 = 0;
      do {
        if (INTERNAL_IN_IPV6_PREFIX._M_elems[lVar7] != (pCVar5->m_addr)._union.direct[lVar7]) {
          if (uVar3 < 0xc) goto LAB_00857e49;
          lVar7 = 0;
          goto LAB_00857e34;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      this->m_net = NET_INTERNAL;
      (pCVar5->m_addr)._union.indirect_contents.indirect =
           *(char **)((long)&(pCVar5->m_addr)._union.indirect_contents.indirect + 6);
      *(undefined2 *)((long)&(pCVar5->m_addr)._union + 8) =
           *(undefined2 *)((long)&(pCVar5->m_addr)._union + 0xe);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,10);
    }
  }
  goto LAB_00857e05;
  while (lVar7 = lVar7 + 1, lVar7 != 0xc) {
LAB_00857e34:
    if (IPV4_IN_IPV6_PREFIX._M_elems[lVar7] != (pCVar5->m_addr)._union.direct[lVar7])
    goto LAB_00857e49;
  }
  goto LAB_00857de9;
LAB_00857e49:
  lVar7 = 0;
  do {
    if (TORV2_IN_IPV6_PREFIX._M_elems[lVar7] != (pCVar5->m_addr)._union.direct[lVar7])
    goto LAB_00857e05;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
LAB_00857de9:
  this->m_net = NET_IPV6;
  local_50._M_dataplus._M_p._0_1_ = '\0';
  prevector<16U,_unsigned_char,_unsigned_int,_int>::assign(&this->m_addr,0x10,(uchar *)&local_50);
LAB_00857e05:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00857f17:
  __stack_chk_fail();
}

Assistant:

void UnserializeV2Stream(Stream& s)
    {
        uint8_t bip155_net;
        s >> bip155_net;

        size_t address_size;
        s >> COMPACTSIZE(address_size);

        if (address_size > MAX_ADDRV2_SIZE) {
            throw std::ios_base::failure(strprintf(
                "Address too long: %u > %u", address_size, MAX_ADDRV2_SIZE));
        }

        m_scope_id = 0;

        if (SetNetFromBIP155Network(bip155_net, address_size)) {
            m_addr.resize(address_size);
            s >> Span{m_addr};

            if (m_net != NET_IPV6) {
                return;
            }

            // Do some special checks on IPv6 addresses.

            // Recognize NET_INTERNAL embedded in IPv6, such addresses are not
            // gossiped but could be coming from addrman, when unserializing from
            // disk.
            if (util::HasPrefix(m_addr, INTERNAL_IN_IPV6_PREFIX)) {
                m_net = NET_INTERNAL;
                memmove(m_addr.data(), m_addr.data() + INTERNAL_IN_IPV6_PREFIX.size(),
                        ADDR_INTERNAL_SIZE);
                m_addr.resize(ADDR_INTERNAL_SIZE);
                return;
            }

            if (!util::HasPrefix(m_addr, IPV4_IN_IPV6_PREFIX) &&
                !util::HasPrefix(m_addr, TORV2_IN_IPV6_PREFIX)) {
                return;
            }

            // IPv4 and TORv2 are not supposed to be embedded in IPv6 (like in V1
            // encoding). Unserialize as !IsValid(), thus ignoring them.
        } else {
            // If we receive an unknown BIP155 network id (from the future?) then
            // ignore the address - unserialize as !IsValid().
            s.ignore(address_size);
        }

        // Mimic a default-constructed CNetAddr object which is !IsValid() and thus
        // will not be gossiped, but continue reading next addresses from the stream.
        m_net = NET_IPV6;
        m_addr.assign(ADDR_IPV6_SIZE, 0x0);
    }